

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSet::spanUTF8
          (UnicodeSet *this,char *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  int iVar2;
  uint8_t *puVar3;
  size_t sVar4;
  int iVar5;
  byte local_16d;
  int local_16c;
  int iStack_168;
  uint8_t __t;
  int32_t prev;
  int32_t start;
  UChar32 c;
  undefined1 local_150 [8];
  UnicodeSetStringSpan strSpan;
  uint32_t which;
  uint8_t *s0;
  USetSpanCondition spanCondition_local;
  int32_t length_local;
  char *s_local;
  UnicodeSet *this_local;
  
  if ((length < 1) || (this->bmpSet == (BMPSet *)0x0)) {
    s0._4_4_ = length;
    if (length < 0) {
      sVar4 = strlen(s);
      s0._4_4_ = (int32_t)sVar4;
    }
    if (s0._4_4_ == 0) {
      this_local._4_4_ = 0;
    }
    else if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
      UVar1 = UVector::isEmpty(this->strings);
      if (UVar1 == '\0') {
        strSpan.staticLengths[0x1f] = 0x26 - (spanCondition == USET_SPAN_NOT_CONTAINED);
        UnicodeSetStringSpan::UnicodeSetStringSpan
                  ((UnicodeSetStringSpan *)local_150,this,this->strings,strSpan.staticLengths[0x1f])
        ;
        UVar1 = UnicodeSetStringSpan::needsStringSpanUTF8((UnicodeSetStringSpan *)local_150);
        if (UVar1 != '\0') {
          this_local._4_4_ =
               UnicodeSetStringSpan::spanUTF8
                         ((UnicodeSetStringSpan *)local_150,(uint8_t *)s,s0._4_4_,spanCondition);
        }
        UnicodeSetStringSpan::~UnicodeSetStringSpan((UnicodeSetStringSpan *)local_150);
        if (UVar1 != '\0') {
          return this_local._4_4_;
        }
      }
      s0._0_4_ = spanCondition;
      if (spanCondition != USET_SPAN_NOT_CONTAINED) {
        s0._0_4_ = USET_SPAN_CONTAINED;
      }
      iStack_168 = 0;
      do {
        local_16c = iStack_168;
        iVar5 = iStack_168 + 1;
        prev = (int32_t)(byte)s[iStack_168];
        if ((s[iStack_168] & 0x80U) != 0) {
          if (iVar5 != s0._4_4_) {
            if ((uint)prev < 0xe0) {
              if (0xc1 < (uint)prev) {
                prev = prev & 0x1f;
                iStack_168 = iVar5;
LAB_003919cf:
                iVar5 = iStack_168;
                if ((byte)(s[iStack_168] + 0x80U) < 0x40) {
                  prev = prev << 6 | (uint)(byte)(s[iStack_168] + 0x80U);
                  iVar5 = iStack_168 + 1;
                  goto LAB_00391a2e;
                }
              }
            }
            else if ((uint)prev < 0xf0) {
              prev = prev & 0xf;
              if (((int)" 000000000000\x1000"[prev] & 1 << (sbyte)((int)(uint)(byte)s[iVar5] >> 5))
                  != 0) {
                local_16d = s[iVar5] & 0x3f;
                iStack_168 = iVar5;
LAB_0039197e:
                prev = prev << 6 | (uint)local_16d;
                iVar5 = iStack_168 + 1;
                iStack_168 = iVar5;
                if (iVar5 != s0._4_4_) goto LAB_003919cf;
              }
            }
            else {
              iVar2 = prev - 0xf0;
              if ((iVar2 < 5) &&
                 (((int)""[(int)(uint)(byte)s[iVar5] >> 4] & 1 << ((byte)iVar2 & 0x1f)) != 0)) {
                prev = iVar2 * 0x40 | (byte)s[iVar5] & 0x3f;
                iStack_168 = iStack_168 + 2;
                iVar5 = iStack_168;
                if ((iStack_168 != s0._4_4_) && (local_16d = s[iStack_168] + 0x80, local_16d < 0x40)
                   ) goto LAB_0039197e;
              }
            }
          }
          iStack_168 = iVar5;
          prev = 0xfffd;
          iVar5 = iStack_168;
        }
LAB_00391a2e:
        iStack_168 = iVar5;
        UVar1 = contains(this,prev);
      } while (((USetSpanCondition)s0 == (int)UVar1) &&
              (local_16c = iStack_168, iStack_168 < s0._4_4_));
      this_local._4_4_ = local_16c;
    }
    else {
      this_local._4_4_ =
           UnicodeSetStringSpan::spanUTF8(this->stringSpan,(uint8_t *)s,s0._4_4_,spanCondition);
    }
  }
  else {
    puVar3 = BMPSet::spanUTF8(this->bmpSet,(uint8_t *)s,length,spanCondition);
    this_local._4_4_ = (int)puVar3 - (int)s;
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSet::spanUTF8(const char *s, int32_t length, USetSpanCondition spanCondition) const {
    if(length>0 && bmpSet!=NULL) {
        const uint8_t *s0=(const uint8_t *)s;
        return (int32_t)(bmpSet->spanUTF8(s0, length, spanCondition)-s0);
    }
    if(length<0) {
        length=(int32_t)uprv_strlen(s);
    }
    if(length==0) {
        return 0;
    }
    if(stringSpan!=NULL) {
        return stringSpan->spanUTF8((const uint8_t *)s, length, spanCondition);
    } else if(!strings->isEmpty()) {
        uint32_t which= spanCondition==USET_SPAN_NOT_CONTAINED ?
                            UnicodeSetStringSpan::FWD_UTF8_NOT_CONTAINED :
                            UnicodeSetStringSpan::FWD_UTF8_CONTAINED;
        UnicodeSetStringSpan strSpan(*this, *strings, which);
        if(strSpan.needsStringSpanUTF8()) {
            return strSpan.spanUTF8((const uint8_t *)s, length, spanCondition);
        }
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    UChar32 c;
    int32_t start=0, prev=0;
    do {
        U8_NEXT_OR_FFFD(s, start, length, c);
        if(spanCondition!=contains(c)) {
            break;
        }
    } while((prev=start)<length);
    return prev;
}